

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O3

void Image_Function::Normalize
               (Image *in,uint32_t startXIn,uint32_t startYIn,Image *out,uint32_t startXOut,
               uint32_t startYOut,uint32_t width,uint32_t height)

{
  uint uVar1;
  bool bVar2;
  undefined8 uVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  char cVar10;
  byte bVar11;
  uint uVar12;
  undefined1 (*pauVar13) [64];
  long lVar14;
  uchar *puVar15;
  ulong uVar16;
  uchar *puVar17;
  byte bVar18;
  uint uVar19;
  ulong uVar20;
  ushort uVar21;
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 in_XMM20 [16];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in,startXIn,startYIn,out,startXOut,startYOut,width,height);
  bVar11 = CommonColorCount<PenguinV_Image::ImageTemplate<unsigned_char>>(in,out);
  uVar1 = in->_rowSize;
  if (uVar1 * height == 0) {
    uVar19 = 0xff;
    bVar18 = 0;
  }
  else {
    auVar30 = vpmovsxbq_avx512f(ZEXT816(0x3f3e3d3c3b3a3938));
    auVar31 = vpmovsxbq_avx512f(ZEXT816(0x3736353433323130));
    auVar32 = vpmovsxbq_avx512f(ZEXT816(0x2f2e2d2c2b2a2928));
    auVar33 = vpmovsxbq_avx512f(ZEXT816(0x2726252423222120));
    auVar34 = vpmovsxbq_avx512f(ZEXT816(0x1f1e1d1c1b1a1918));
    auVar35 = vpmovsxbq_avx512f(ZEXT816(0x1716151413121110));
    auVar36 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar37 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    bVar18 = 0;
    uVar12 = bVar11 * width;
    puVar17 = in->_data + (ulong)(bVar11 * startXIn) + (ulong)(uVar1 * startYIn);
    auVar38 = vpbroadcastq_avx512f();
    uVar19 = 0xff;
    puVar15 = puVar17 + uVar1 * height;
    do {
      if (uVar12 != 0) {
        auVar39 = vpbroadcastb_avx512bw();
        auVar40 = vpbroadcastb_avx512bw();
        uVar16 = 0;
        do {
          auVar41 = vpbroadcastq_avx512f();
          auVar42 = vmovdqa64_avx512f(auVar39);
          auVar43 = vmovdqa64_avx512f(auVar40);
          auVar39 = vporq_avx512f(auVar41,auVar36);
          auVar40 = vporq_avx512f(auVar41,auVar37);
          auVar44 = vporq_avx512f(auVar41,auVar34);
          auVar45 = vporq_avx512f(auVar41,auVar35);
          auVar46 = vporq_avx512f(auVar41,auVar32);
          auVar47 = vporq_avx512f(auVar41,auVar33);
          auVar48 = vporq_avx512f(auVar41,auVar30);
          auVar41 = vporq_avx512f(auVar41,auVar31);
          uVar3 = vpcmpuq_avx512f(auVar40,auVar38,2);
          bVar11 = (byte)uVar3;
          uVar3 = vpcmpuq_avx512f(auVar39,auVar38,2);
          bVar18 = (byte)uVar3;
          uVar3 = vpcmpuq_avx512f(auVar44,auVar38,2);
          bVar5 = (byte)uVar3;
          uVar3 = vpcmpuq_avx512f(auVar48,auVar38,2);
          bVar9 = (byte)uVar3;
          uVar3 = vpcmpuq_avx512f(auVar45,auVar38,2);
          bVar4 = (byte)uVar3;
          uVar3 = vpcmpuq_avx512f(auVar46,auVar38,2);
          bVar7 = (byte)uVar3;
          uVar3 = vpcmpuq_avx512f(auVar47,auVar38,2);
          bVar6 = (byte)uVar3;
          uVar3 = vpcmpuq_avx512f(auVar41,auVar38,2);
          bVar8 = (byte)uVar3;
          uVar21 = CONCAT11(bVar9,bVar8);
          uVar19 = CONCAT22(uVar21,CONCAT11(bVar7,bVar6));
          uVar20 = CONCAT44(uVar19,CONCAT22(CONCAT11(bVar5,bVar4),CONCAT11(bVar18,bVar11)));
          auVar39 = vmovdqu8_avx512bw(*(undefined1 (*) [64])(puVar17 + uVar16));
          auVar40[1] = ((byte)(uVar20 >> 1) & 1) * auVar39[1];
          auVar40[0] = (bVar11 & 1) * auVar39[0];
          auVar40[2] = ((byte)(uVar20 >> 2) & 1) * auVar39[2];
          auVar40[3] = ((byte)(uVar20 >> 3) & 1) * auVar39[3];
          auVar40[4] = ((byte)(uVar20 >> 4) & 1) * auVar39[4];
          auVar40[5] = ((byte)(uVar20 >> 5) & 1) * auVar39[5];
          auVar40[6] = ((byte)(uVar20 >> 6) & 1) * auVar39[6];
          auVar40[7] = ((byte)(uVar20 >> 7) & 1) * auVar39[7];
          auVar40[8] = (bVar18 & 1) * auVar39[8];
          auVar40[9] = ((byte)(uVar20 >> 9) & 1) * auVar39[9];
          auVar40[10] = ((byte)(uVar20 >> 10) & 1) * auVar39[10];
          auVar40[0xb] = ((byte)(uVar20 >> 0xb) & 1) * auVar39[0xb];
          auVar40[0xc] = ((byte)(uVar20 >> 0xc) & 1) * auVar39[0xc];
          auVar40[0xd] = ((byte)(uVar20 >> 0xd) & 1) * auVar39[0xd];
          auVar40[0xe] = ((byte)(uVar20 >> 0xe) & 1) * auVar39[0xe];
          auVar40[0xf] = ((byte)(uVar20 >> 0xf) & 1) * auVar39[0xf];
          auVar40[0x10] = (bVar4 & 1) * auVar39[0x10];
          auVar40[0x11] = ((byte)(uVar20 >> 0x11) & 1) * auVar39[0x11];
          auVar40[0x12] = ((byte)(uVar20 >> 0x12) & 1) * auVar39[0x12];
          auVar40[0x13] = ((byte)(uVar20 >> 0x13) & 1) * auVar39[0x13];
          auVar40[0x14] = ((byte)(uVar20 >> 0x14) & 1) * auVar39[0x14];
          auVar40[0x15] = ((byte)(uVar20 >> 0x15) & 1) * auVar39[0x15];
          auVar40[0x16] = ((byte)(uVar20 >> 0x16) & 1) * auVar39[0x16];
          auVar40[0x17] = ((byte)(uVar20 >> 0x17) & 1) * auVar39[0x17];
          auVar40[0x18] = (bVar5 & 1) * auVar39[0x18];
          auVar40[0x19] = ((byte)(uVar20 >> 0x19) & 1) * auVar39[0x19];
          auVar40[0x1a] = ((byte)(uVar20 >> 0x1a) & 1) * auVar39[0x1a];
          auVar40[0x1b] = ((byte)(uVar20 >> 0x1b) & 1) * auVar39[0x1b];
          auVar40[0x1c] = ((byte)(uVar20 >> 0x1c) & 1) * auVar39[0x1c];
          auVar40[0x1d] = ((byte)(uVar20 >> 0x1d) & 1) * auVar39[0x1d];
          auVar40[0x1e] = ((byte)(uVar20 >> 0x1e) & 1) * auVar39[0x1e];
          auVar40[0x1f] = ((byte)(uVar20 >> 0x1f) & 1) * auVar39[0x1f];
          auVar40[0x20] = (bVar6 & 1) * auVar39[0x20];
          auVar40[0x21] = ((byte)(uVar19 >> 1) & 1) * auVar39[0x21];
          auVar40[0x22] = ((byte)(uVar19 >> 2) & 1) * auVar39[0x22];
          auVar40[0x23] = ((byte)(uVar19 >> 3) & 1) * auVar39[0x23];
          auVar40[0x24] = ((byte)(uVar19 >> 4) & 1) * auVar39[0x24];
          auVar40[0x25] = ((byte)(uVar19 >> 5) & 1) * auVar39[0x25];
          auVar40[0x26] = ((byte)(uVar19 >> 6) & 1) * auVar39[0x26];
          auVar40[0x27] = ((byte)(uVar19 >> 7) & 1) * auVar39[0x27];
          auVar40[0x28] = (bVar7 & 1) * auVar39[0x28];
          auVar40[0x29] = ((byte)(uVar19 >> 9) & 1) * auVar39[0x29];
          auVar40[0x2a] = ((byte)(uVar19 >> 10) & 1) * auVar39[0x2a];
          auVar40[0x2b] = ((byte)(uVar19 >> 0xb) & 1) * auVar39[0x2b];
          auVar40[0x2c] = ((byte)(uVar19 >> 0xc) & 1) * auVar39[0x2c];
          auVar40[0x2d] = ((byte)(uVar19 >> 0xd) & 1) * auVar39[0x2d];
          auVar40[0x2e] = ((byte)(uVar19 >> 0xe) & 1) * auVar39[0x2e];
          auVar40[0x2f] = ((byte)(uVar19 >> 0xf) & 1) * auVar39[0x2f];
          auVar40[0x30] = (bVar8 & 1) * auVar39[0x30];
          auVar40[0x31] = ((byte)(uVar21 >> 1) & 1) * auVar39[0x31];
          auVar40[0x32] = ((byte)(uVar21 >> 2) & 1) * auVar39[0x32];
          auVar40[0x33] = ((byte)(uVar21 >> 3) & 1) * auVar39[0x33];
          auVar40[0x34] = ((byte)(uVar21 >> 4) & 1) * auVar39[0x34];
          auVar40[0x35] = ((byte)(uVar21 >> 5) & 1) * auVar39[0x35];
          auVar40[0x36] = ((byte)(uVar21 >> 6) & 1) * auVar39[0x36];
          auVar40[0x37] = ((byte)(uVar21 >> 7) & 1) * auVar39[0x37];
          auVar40[0x38] = (bVar9 & 1) * auVar39[0x38];
          auVar40[0x39] = (bVar9 >> 1 & 1) * auVar39[0x39];
          auVar40[0x3a] = (bVar9 >> 2 & 1) * auVar39[0x3a];
          auVar40[0x3b] = (bVar9 >> 3 & 1) * auVar39[0x3b];
          auVar40[0x3c] = (bVar9 >> 4 & 1) * auVar39[0x3c];
          auVar40[0x3d] = (bVar9 >> 5 & 1) * auVar39[0x3d];
          auVar40[0x3e] = (bVar9 >> 6 & 1) * auVar39[0x3e];
          cVar10 = (char)bVar9 >> 7;
          auVar40[0x3f] = -cVar10 * auVar39[0x3f];
          uVar16 = uVar16 + 0x40;
          auVar39 = vpminub_avx512bw(auVar42,auVar40);
          auVar40 = vpmaxub_avx512bw(auVar43,auVar40);
        } while (((ulong)uVar12 + 0x3f & 0xffffffffffffffc0) != uVar16);
        auVar39 = vmovdqu8_avx512bw(auVar39);
        auVar26[0] = (bVar11 & 1) * auVar39[0] | !(bool)(bVar11 & 1) * auVar42[0];
        bVar2 = (bool)((byte)(uVar20 >> 1) & 1);
        auVar26[1] = bVar2 * auVar39[1] | !bVar2 * auVar42[1];
        bVar2 = (bool)((byte)(uVar20 >> 2) & 1);
        auVar26[2] = bVar2 * auVar39[2] | !bVar2 * auVar42[2];
        bVar2 = (bool)((byte)(uVar20 >> 3) & 1);
        auVar26[3] = bVar2 * auVar39[3] | !bVar2 * auVar42[3];
        bVar2 = (bool)((byte)(uVar20 >> 4) & 1);
        auVar26[4] = bVar2 * auVar39[4] | !bVar2 * auVar42[4];
        bVar2 = (bool)((byte)(uVar20 >> 5) & 1);
        auVar26[5] = bVar2 * auVar39[5] | !bVar2 * auVar42[5];
        bVar2 = (bool)((byte)(uVar20 >> 6) & 1);
        auVar26[6] = bVar2 * auVar39[6] | !bVar2 * auVar42[6];
        bVar2 = (bool)((byte)(uVar20 >> 7) & 1);
        auVar26[7] = bVar2 * auVar39[7] | !bVar2 * auVar42[7];
        auVar26[8] = (bVar18 & 1) * auVar39[8] | !(bool)(bVar18 & 1) * auVar42[8];
        bVar2 = (bool)((byte)(uVar20 >> 9) & 1);
        auVar26[9] = bVar2 * auVar39[9] | !bVar2 * auVar42[9];
        bVar2 = (bool)((byte)(uVar20 >> 10) & 1);
        auVar26[10] = bVar2 * auVar39[10] | !bVar2 * auVar42[10];
        bVar2 = (bool)((byte)(uVar20 >> 0xb) & 1);
        auVar26[0xb] = bVar2 * auVar39[0xb] | !bVar2 * auVar42[0xb];
        bVar2 = (bool)((byte)(uVar20 >> 0xc) & 1);
        auVar26[0xc] = bVar2 * auVar39[0xc] | !bVar2 * auVar42[0xc];
        bVar2 = (bool)((byte)(uVar20 >> 0xd) & 1);
        auVar26[0xd] = bVar2 * auVar39[0xd] | !bVar2 * auVar42[0xd];
        bVar2 = (bool)((byte)(uVar20 >> 0xe) & 1);
        auVar26[0xe] = bVar2 * auVar39[0xe] | !bVar2 * auVar42[0xe];
        bVar2 = (bool)((byte)(uVar20 >> 0xf) & 1);
        auVar26[0xf] = bVar2 * auVar39[0xf] | !bVar2 * auVar42[0xf];
        auVar26[0x10] = (bVar4 & 1) * auVar39[0x10] | !(bool)(bVar4 & 1) * auVar42[0x10];
        bVar2 = (bool)((byte)(uVar20 >> 0x11) & 1);
        auVar26[0x11] = bVar2 * auVar39[0x11] | !bVar2 * auVar42[0x11];
        bVar2 = (bool)((byte)(uVar20 >> 0x12) & 1);
        auVar26[0x12] = bVar2 * auVar39[0x12] | !bVar2 * auVar42[0x12];
        bVar2 = (bool)((byte)(uVar20 >> 0x13) & 1);
        auVar26[0x13] = bVar2 * auVar39[0x13] | !bVar2 * auVar42[0x13];
        bVar2 = (bool)((byte)(uVar20 >> 0x14) & 1);
        auVar26[0x14] = bVar2 * auVar39[0x14] | !bVar2 * auVar42[0x14];
        bVar2 = (bool)((byte)(uVar20 >> 0x15) & 1);
        auVar26[0x15] = bVar2 * auVar39[0x15] | !bVar2 * auVar42[0x15];
        bVar2 = (bool)((byte)(uVar20 >> 0x16) & 1);
        auVar26[0x16] = bVar2 * auVar39[0x16] | !bVar2 * auVar42[0x16];
        bVar2 = (bool)((byte)(uVar20 >> 0x17) & 1);
        auVar26[0x17] = bVar2 * auVar39[0x17] | !bVar2 * auVar42[0x17];
        auVar26[0x18] = (bVar5 & 1) * auVar39[0x18] | !(bool)(bVar5 & 1) * auVar42[0x18];
        bVar2 = (bool)((byte)(uVar20 >> 0x19) & 1);
        auVar26[0x19] = bVar2 * auVar39[0x19] | !bVar2 * auVar42[0x19];
        bVar2 = (bool)((byte)(uVar20 >> 0x1a) & 1);
        auVar26[0x1a] = bVar2 * auVar39[0x1a] | !bVar2 * auVar42[0x1a];
        bVar2 = (bool)((byte)(uVar20 >> 0x1b) & 1);
        auVar26[0x1b] = bVar2 * auVar39[0x1b] | !bVar2 * auVar42[0x1b];
        bVar2 = (bool)((byte)(uVar20 >> 0x1c) & 1);
        auVar26[0x1c] = bVar2 * auVar39[0x1c] | !bVar2 * auVar42[0x1c];
        bVar2 = (bool)((byte)(uVar20 >> 0x1d) & 1);
        auVar26[0x1d] = bVar2 * auVar39[0x1d] | !bVar2 * auVar42[0x1d];
        bVar2 = (bool)((byte)(uVar20 >> 0x1e) & 1);
        auVar26[0x1e] = bVar2 * auVar39[0x1e] | !bVar2 * auVar42[0x1e];
        bVar2 = (bool)((byte)(uVar20 >> 0x1f) & 1);
        auVar26[0x1f] = bVar2 * auVar39[0x1f] | !bVar2 * auVar42[0x1f];
        auVar41[0x20] = (bVar6 & 1) * auVar39[0x20] | !(bool)(bVar6 & 1) * auVar42[0x20];
        auVar41._0_32_ = auVar26;
        bVar2 = (bool)((byte)(uVar19 >> 1) & 1);
        auVar41[0x21] = bVar2 * auVar39[0x21] | !bVar2 * auVar42[0x21];
        bVar2 = (bool)((byte)(uVar19 >> 2) & 1);
        auVar41[0x22] = bVar2 * auVar39[0x22] | !bVar2 * auVar42[0x22];
        bVar2 = (bool)((byte)(uVar19 >> 3) & 1);
        auVar41[0x23] = bVar2 * auVar39[0x23] | !bVar2 * auVar42[0x23];
        bVar2 = (bool)((byte)(uVar19 >> 4) & 1);
        auVar41[0x24] = bVar2 * auVar39[0x24] | !bVar2 * auVar42[0x24];
        bVar2 = (bool)((byte)(uVar19 >> 5) & 1);
        auVar41[0x25] = bVar2 * auVar39[0x25] | !bVar2 * auVar42[0x25];
        bVar2 = (bool)((byte)(uVar19 >> 6) & 1);
        auVar41[0x26] = bVar2 * auVar39[0x26] | !bVar2 * auVar42[0x26];
        bVar2 = (bool)((byte)(uVar19 >> 7) & 1);
        auVar41[0x27] = bVar2 * auVar39[0x27] | !bVar2 * auVar42[0x27];
        auVar41[0x28] = (bVar7 & 1) * auVar39[0x28] | !(bool)(bVar7 & 1) * auVar42[0x28];
        bVar2 = (bool)((byte)(uVar19 >> 9) & 1);
        auVar41[0x29] = bVar2 * auVar39[0x29] | !bVar2 * auVar42[0x29];
        bVar2 = (bool)((byte)(uVar19 >> 10) & 1);
        auVar41[0x2a] = bVar2 * auVar39[0x2a] | !bVar2 * auVar42[0x2a];
        bVar2 = (bool)((byte)(uVar19 >> 0xb) & 1);
        auVar41[0x2b] = bVar2 * auVar39[0x2b] | !bVar2 * auVar42[0x2b];
        bVar2 = (bool)((byte)(uVar19 >> 0xc) & 1);
        auVar41[0x2c] = bVar2 * auVar39[0x2c] | !bVar2 * auVar42[0x2c];
        bVar2 = (bool)((byte)(uVar19 >> 0xd) & 1);
        auVar41[0x2d] = bVar2 * auVar39[0x2d] | !bVar2 * auVar42[0x2d];
        bVar2 = (bool)((byte)(uVar19 >> 0xe) & 1);
        auVar41[0x2e] = bVar2 * auVar39[0x2e] | !bVar2 * auVar42[0x2e];
        bVar2 = (bool)((byte)(uVar19 >> 0xf) & 1);
        auVar41[0x2f] = bVar2 * auVar39[0x2f] | !bVar2 * auVar42[0x2f];
        auVar41[0x30] = (bVar8 & 1) * auVar39[0x30] | !(bool)(bVar8 & 1) * auVar42[0x30];
        bVar2 = (bool)((byte)(uVar21 >> 1) & 1);
        auVar41[0x31] = bVar2 * auVar39[0x31] | !bVar2 * auVar42[0x31];
        bVar2 = (bool)((byte)(uVar21 >> 2) & 1);
        auVar41[0x32] = bVar2 * auVar39[0x32] | !bVar2 * auVar42[0x32];
        bVar2 = (bool)((byte)(uVar21 >> 3) & 1);
        auVar41[0x33] = bVar2 * auVar39[0x33] | !bVar2 * auVar42[0x33];
        bVar2 = (bool)((byte)(uVar21 >> 4) & 1);
        auVar41[0x34] = bVar2 * auVar39[0x34] | !bVar2 * auVar42[0x34];
        bVar2 = (bool)((byte)(uVar21 >> 5) & 1);
        auVar41[0x35] = bVar2 * auVar39[0x35] | !bVar2 * auVar42[0x35];
        bVar2 = (bool)((byte)(uVar21 >> 6) & 1);
        auVar41[0x36] = bVar2 * auVar39[0x36] | !bVar2 * auVar42[0x36];
        bVar2 = (bool)((byte)(uVar21 >> 7) & 1);
        auVar41[0x37] = bVar2 * auVar39[0x37] | !bVar2 * auVar42[0x37];
        auVar41[0x38] = (bVar9 & 1) * auVar39[0x38] | !(bool)(bVar9 & 1) * auVar42[0x38];
        bVar2 = (bool)(bVar9 >> 1 & 1);
        auVar41[0x39] = bVar2 * auVar39[0x39] | !bVar2 * auVar42[0x39];
        bVar2 = (bool)(bVar9 >> 2 & 1);
        auVar41[0x3a] = bVar2 * auVar39[0x3a] | !bVar2 * auVar42[0x3a];
        bVar2 = (bool)(bVar9 >> 3 & 1);
        auVar41[0x3b] = bVar2 * auVar39[0x3b] | !bVar2 * auVar42[0x3b];
        bVar2 = (bool)(bVar9 >> 4 & 1);
        auVar41[0x3c] = bVar2 * auVar39[0x3c] | !bVar2 * auVar42[0x3c];
        bVar2 = (bool)(bVar9 >> 5 & 1);
        auVar41[0x3d] = bVar2 * auVar39[0x3d] | !bVar2 * auVar42[0x3d];
        bVar2 = (bool)(bVar9 >> 6 & 1);
        auVar41[0x3e] = bVar2 * auVar39[0x3e] | !bVar2 * auVar42[0x3e];
        auVar41[0x3f] = -cVar10 * auVar39[0x3f] | !(bool)-cVar10 * auVar42[0x3f];
        auVar25 = vextracti64x4_avx512f(auVar41,1);
        auVar39 = vmovdqu8_avx512bw(auVar40);
        auVar27[0] = (bVar11 & 1) * auVar39[0] | !(bool)(bVar11 & 1) * auVar43[0];
        bVar2 = (bool)((byte)(uVar20 >> 1) & 1);
        auVar27[1] = bVar2 * auVar39[1] | !bVar2 * auVar43[1];
        bVar2 = (bool)((byte)(uVar20 >> 2) & 1);
        auVar27[2] = bVar2 * auVar39[2] | !bVar2 * auVar43[2];
        bVar2 = (bool)((byte)(uVar20 >> 3) & 1);
        auVar27[3] = bVar2 * auVar39[3] | !bVar2 * auVar43[3];
        bVar2 = (bool)((byte)(uVar20 >> 4) & 1);
        auVar27[4] = bVar2 * auVar39[4] | !bVar2 * auVar43[4];
        bVar2 = (bool)((byte)(uVar20 >> 5) & 1);
        auVar27[5] = bVar2 * auVar39[5] | !bVar2 * auVar43[5];
        bVar2 = (bool)((byte)(uVar20 >> 6) & 1);
        auVar27[6] = bVar2 * auVar39[6] | !bVar2 * auVar43[6];
        bVar2 = (bool)((byte)(uVar20 >> 7) & 1);
        auVar27[7] = bVar2 * auVar39[7] | !bVar2 * auVar43[7];
        auVar27[8] = (bVar18 & 1) * auVar39[8] | !(bool)(bVar18 & 1) * auVar43[8];
        bVar2 = (bool)((byte)(uVar20 >> 9) & 1);
        auVar27[9] = bVar2 * auVar39[9] | !bVar2 * auVar43[9];
        bVar2 = (bool)((byte)(uVar20 >> 10) & 1);
        auVar27[10] = bVar2 * auVar39[10] | !bVar2 * auVar43[10];
        bVar2 = (bool)((byte)(uVar20 >> 0xb) & 1);
        auVar27[0xb] = bVar2 * auVar39[0xb] | !bVar2 * auVar43[0xb];
        bVar2 = (bool)((byte)(uVar20 >> 0xc) & 1);
        auVar27[0xc] = bVar2 * auVar39[0xc] | !bVar2 * auVar43[0xc];
        bVar2 = (bool)((byte)(uVar20 >> 0xd) & 1);
        auVar27[0xd] = bVar2 * auVar39[0xd] | !bVar2 * auVar43[0xd];
        bVar2 = (bool)((byte)(uVar20 >> 0xe) & 1);
        auVar27[0xe] = bVar2 * auVar39[0xe] | !bVar2 * auVar43[0xe];
        bVar2 = (bool)((byte)(uVar20 >> 0xf) & 1);
        auVar27[0xf] = bVar2 * auVar39[0xf] | !bVar2 * auVar43[0xf];
        auVar27[0x10] = (bVar4 & 1) * auVar39[0x10] | !(bool)(bVar4 & 1) * auVar43[0x10];
        bVar2 = (bool)((byte)(uVar20 >> 0x11) & 1);
        auVar27[0x11] = bVar2 * auVar39[0x11] | !bVar2 * auVar43[0x11];
        bVar2 = (bool)((byte)(uVar20 >> 0x12) & 1);
        auVar27[0x12] = bVar2 * auVar39[0x12] | !bVar2 * auVar43[0x12];
        bVar2 = (bool)((byte)(uVar20 >> 0x13) & 1);
        auVar27[0x13] = bVar2 * auVar39[0x13] | !bVar2 * auVar43[0x13];
        bVar2 = (bool)((byte)(uVar20 >> 0x14) & 1);
        auVar27[0x14] = bVar2 * auVar39[0x14] | !bVar2 * auVar43[0x14];
        bVar2 = (bool)((byte)(uVar20 >> 0x15) & 1);
        auVar27[0x15] = bVar2 * auVar39[0x15] | !bVar2 * auVar43[0x15];
        bVar2 = (bool)((byte)(uVar20 >> 0x16) & 1);
        auVar27[0x16] = bVar2 * auVar39[0x16] | !bVar2 * auVar43[0x16];
        bVar2 = (bool)((byte)(uVar20 >> 0x17) & 1);
        auVar27[0x17] = bVar2 * auVar39[0x17] | !bVar2 * auVar43[0x17];
        auVar27[0x18] = (bVar5 & 1) * auVar39[0x18] | !(bool)(bVar5 & 1) * auVar43[0x18];
        bVar2 = (bool)((byte)(uVar20 >> 0x19) & 1);
        auVar27[0x19] = bVar2 * auVar39[0x19] | !bVar2 * auVar43[0x19];
        bVar2 = (bool)((byte)(uVar20 >> 0x1a) & 1);
        auVar27[0x1a] = bVar2 * auVar39[0x1a] | !bVar2 * auVar43[0x1a];
        bVar2 = (bool)((byte)(uVar20 >> 0x1b) & 1);
        auVar27[0x1b] = bVar2 * auVar39[0x1b] | !bVar2 * auVar43[0x1b];
        bVar2 = (bool)((byte)(uVar20 >> 0x1c) & 1);
        auVar27[0x1c] = bVar2 * auVar39[0x1c] | !bVar2 * auVar43[0x1c];
        bVar2 = (bool)((byte)(uVar20 >> 0x1d) & 1);
        auVar27[0x1d] = bVar2 * auVar39[0x1d] | !bVar2 * auVar43[0x1d];
        bVar2 = (bool)((byte)(uVar20 >> 0x1e) & 1);
        auVar27[0x1e] = bVar2 * auVar39[0x1e] | !bVar2 * auVar43[0x1e];
        bVar2 = (bool)((byte)(uVar20 >> 0x1f) & 1);
        auVar27[0x1f] = bVar2 * auVar39[0x1f] | !bVar2 * auVar43[0x1f];
        auVar42[0x20] = (bVar6 & 1) * auVar39[0x20] | !(bool)(bVar6 & 1) * auVar43[0x20];
        auVar42._0_32_ = auVar27;
        bVar2 = (bool)((byte)(uVar19 >> 1) & 1);
        auVar42[0x21] = bVar2 * auVar39[0x21] | !bVar2 * auVar43[0x21];
        bVar2 = (bool)((byte)(uVar19 >> 2) & 1);
        auVar42[0x22] = bVar2 * auVar39[0x22] | !bVar2 * auVar43[0x22];
        bVar2 = (bool)((byte)(uVar19 >> 3) & 1);
        auVar42[0x23] = bVar2 * auVar39[0x23] | !bVar2 * auVar43[0x23];
        bVar2 = (bool)((byte)(uVar19 >> 4) & 1);
        auVar42[0x24] = bVar2 * auVar39[0x24] | !bVar2 * auVar43[0x24];
        bVar2 = (bool)((byte)(uVar19 >> 5) & 1);
        auVar42[0x25] = bVar2 * auVar39[0x25] | !bVar2 * auVar43[0x25];
        bVar2 = (bool)((byte)(uVar19 >> 6) & 1);
        auVar42[0x26] = bVar2 * auVar39[0x26] | !bVar2 * auVar43[0x26];
        bVar2 = (bool)((byte)(uVar19 >> 7) & 1);
        auVar42[0x27] = bVar2 * auVar39[0x27] | !bVar2 * auVar43[0x27];
        auVar42[0x28] = (bVar7 & 1) * auVar39[0x28] | !(bool)(bVar7 & 1) * auVar43[0x28];
        bVar2 = (bool)((byte)(uVar19 >> 9) & 1);
        auVar42[0x29] = bVar2 * auVar39[0x29] | !bVar2 * auVar43[0x29];
        bVar2 = (bool)((byte)(uVar19 >> 10) & 1);
        auVar42[0x2a] = bVar2 * auVar39[0x2a] | !bVar2 * auVar43[0x2a];
        bVar2 = (bool)((byte)(uVar19 >> 0xb) & 1);
        auVar42[0x2b] = bVar2 * auVar39[0x2b] | !bVar2 * auVar43[0x2b];
        bVar2 = (bool)((byte)(uVar19 >> 0xc) & 1);
        auVar42[0x2c] = bVar2 * auVar39[0x2c] | !bVar2 * auVar43[0x2c];
        bVar2 = (bool)((byte)(uVar19 >> 0xd) & 1);
        auVar42[0x2d] = bVar2 * auVar39[0x2d] | !bVar2 * auVar43[0x2d];
        bVar2 = (bool)((byte)(uVar19 >> 0xe) & 1);
        auVar42[0x2e] = bVar2 * auVar39[0x2e] | !bVar2 * auVar43[0x2e];
        bVar2 = (bool)((byte)(uVar19 >> 0xf) & 1);
        auVar42[0x2f] = bVar2 * auVar39[0x2f] | !bVar2 * auVar43[0x2f];
        auVar42[0x30] = (bVar8 & 1) * auVar39[0x30] | !(bool)(bVar8 & 1) * auVar43[0x30];
        bVar2 = (bool)((byte)(uVar21 >> 1) & 1);
        auVar42[0x31] = bVar2 * auVar39[0x31] | !bVar2 * auVar43[0x31];
        bVar2 = (bool)((byte)(uVar21 >> 2) & 1);
        auVar42[0x32] = bVar2 * auVar39[0x32] | !bVar2 * auVar43[0x32];
        bVar2 = (bool)((byte)(uVar21 >> 3) & 1);
        auVar42[0x33] = bVar2 * auVar39[0x33] | !bVar2 * auVar43[0x33];
        bVar2 = (bool)((byte)(uVar21 >> 4) & 1);
        auVar42[0x34] = bVar2 * auVar39[0x34] | !bVar2 * auVar43[0x34];
        bVar2 = (bool)((byte)(uVar21 >> 5) & 1);
        auVar42[0x35] = bVar2 * auVar39[0x35] | !bVar2 * auVar43[0x35];
        bVar2 = (bool)((byte)(uVar21 >> 6) & 1);
        auVar42[0x36] = bVar2 * auVar39[0x36] | !bVar2 * auVar43[0x36];
        bVar2 = (bool)((byte)(uVar21 >> 7) & 1);
        auVar42[0x37] = bVar2 * auVar39[0x37] | !bVar2 * auVar43[0x37];
        auVar42[0x38] = (bVar9 & 1) * auVar39[0x38] | !(bool)(bVar9 & 1) * auVar43[0x38];
        bVar2 = (bool)(bVar9 >> 1 & 1);
        auVar42[0x39] = bVar2 * auVar39[0x39] | !bVar2 * auVar43[0x39];
        bVar2 = (bool)(bVar9 >> 2 & 1);
        auVar42[0x3a] = bVar2 * auVar39[0x3a] | !bVar2 * auVar43[0x3a];
        bVar2 = (bool)(bVar9 >> 3 & 1);
        auVar42[0x3b] = bVar2 * auVar39[0x3b] | !bVar2 * auVar43[0x3b];
        bVar2 = (bool)(bVar9 >> 4 & 1);
        auVar42[0x3c] = bVar2 * auVar39[0x3c] | !bVar2 * auVar43[0x3c];
        bVar2 = (bool)(bVar9 >> 5 & 1);
        auVar42[0x3d] = bVar2 * auVar39[0x3d] | !bVar2 * auVar43[0x3d];
        bVar2 = (bool)(bVar9 >> 6 & 1);
        auVar42[0x3e] = bVar2 * auVar39[0x3e] | !bVar2 * auVar43[0x3e];
        auVar42[0x3f] = -cVar10 * auVar39[0x3f] | !(bool)-cVar10 * auVar43[0x3f];
        auVar26 = vpminub_avx2(auVar26,auVar25);
        auVar22 = vpminub_avx(auVar26._0_16_,auVar26._16_16_);
        auVar51 = vpsrlw_avx(auVar22,8);
        auVar22 = vpminub_avx(auVar22,auVar51);
        auVar22 = vphminposuw_avx(auVar22);
        uVar19 = auVar22._0_4_;
        auVar26 = vextracti64x4_avx512f(auVar42,1);
        auVar26 = vpmaxub_avx2(auVar27,auVar26);
        auVar22 = vpmaxub_avx(auVar26._0_16_,auVar26._16_16_);
        auVar22 = vpternlogq_avx512vl(auVar22,auVar22,auVar22,0xf);
        auVar51 = vpsrlw_avx(auVar22,8);
        auVar22 = vpminub_avx(auVar22,auVar51);
        auVar22 = vphminposuw_avx(auVar22);
        bVar18 = ~auVar22[0];
      }
      puVar17 = puVar17 + uVar1;
    } while (puVar17 != puVar15);
  }
  if ((bVar18 != 0xff || (byte)uVar19 != 0) && ((byte)uVar19 != bVar18)) {
    pauVar13 = (undefined1 (*) [64])operator_new(0x100);
    local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)(pauVar13 + 4);
    auVar37 = ZEXT1664((undefined1  [16])0x0);
    auVar31 = vbroadcastsd_avx512f(ZEXT816(0x3fe0000000000000));
    auVar32 = vpmovsxbd_avx512f(_DAT_00117104);
    auVar33 = vpmovsxbd_avx512f(_DAT_00117114);
    auVar34 = vpmovsxbd_avx512f(_DAT_00117124);
    auVar35 = vpmovsxbd_avx512f(_DAT_00117134);
    auVar36 = vpbroadcastd_avx512f(ZEXT416(0x40));
    auVar30 = vmovdqu64_avx512f(auVar37);
    *pauVar13 = auVar30;
    auVar30 = vmovdqu64_avx512f(auVar37);
    pauVar13[1] = auVar30;
    auVar30 = vmovdqu64_avx512f(auVar37);
    pauVar13[2] = auVar30;
    auVar30 = vmovdqu64_avx512f(auVar37);
    pauVar13[3] = auVar30;
    auVar22 = vcvtsi2sd_avx512f(in_XMM20,(uint)bVar18 - (uVar19 & 0xff));
    lVar14 = 0;
    auVar22._0_8_ = 255.0 / auVar22._0_8_;
    auVar22._8_8_ = 0;
    auVar30 = vpbroadcastd_avx512f();
    auVar37 = vbroadcastsd_avx512f(auVar22);
    do {
      auVar38 = vpsubd_avx512f(auVar35,auVar30);
      auVar39 = vpsubd_avx512f(auVar34,auVar30);
      auVar40 = vpsubd_avx512f(auVar33,auVar30);
      auVar41 = vpsubd_avx512f(auVar32,auVar30);
      auVar35 = vpaddd_avx512f(auVar35,auVar36);
      auVar34 = vpaddd_avx512f(auVar34,auVar36);
      auVar33 = vpaddd_avx512f(auVar33,auVar36);
      auVar32 = vpaddd_avx512f(auVar32,auVar36);
      auVar42 = vcvtdq2pd_avx512f(auVar38._0_32_);
      auVar43 = vcvtdq2pd_avx512f(auVar39._0_32_);
      auVar44 = vcvtdq2pd_avx512f(auVar40._0_32_);
      auVar45 = vcvtdq2pd_avx512f(auVar41._0_32_);
      auVar26 = vextracti64x4_avx512f(auVar38,1);
      auVar25 = vextracti64x4_avx512f(auVar39,1);
      auVar27 = vextracti64x4_avx512f(auVar40,1);
      auVar28 = vextracti64x4_avx512f(auVar41,1);
      auVar38 = vcvtdq2pd_avx512f(auVar26);
      auVar39 = vcvtdq2pd_avx512f(auVar25);
      auVar40 = vcvtdq2pd_avx512f(auVar27);
      auVar41 = vcvtdq2pd_avx512f(auVar28);
      auVar43 = vfmadd213pd_avx512f(auVar43,auVar37,auVar31);
      auVar42 = vfmadd213pd_avx512f(auVar42,auVar37,auVar31);
      auVar44 = vfmadd213pd_avx512f(auVar44,auVar37,auVar31);
      auVar45 = vfmadd213pd_avx512f(auVar45,auVar37,auVar31);
      auVar39 = vfmadd213pd_avx512f(auVar39,auVar37,auVar31);
      auVar38 = vfmadd213pd_avx512f(auVar38,auVar37,auVar31);
      auVar41 = vfmadd213pd_avx512f(auVar41,auVar37,auVar31);
      auVar40 = vfmadd213pd_avx512f(auVar40,auVar37,auVar31);
      auVar26 = vcvttpd2dq_avx512f(auVar42);
      auVar25 = vcvttpd2dq_avx512f(auVar43);
      auVar27 = vcvttpd2dq_avx512f(auVar44);
      auVar28 = vcvttpd2dq_avx512f(auVar38);
      auVar29 = vcvttpd2dq_avx512f(auVar39);
      auVar22 = vpmovdb_avx512vl(auVar26);
      auVar51 = vpmovdb_avx512vl(auVar25);
      auVar23 = vpmovdb_avx512vl(auVar28);
      auVar24 = vpmovdb_avx512vl(auVar29);
      auVar52._8_8_ = 0;
      auVar52._0_8_ = auVar51._0_8_;
      auVar49._8_8_ = 0;
      auVar49._0_8_ = auVar22._0_8_;
      auVar22 = vpmovdb_avx512vl(auVar27);
      auVar26 = vcvttpd2dq_avx512f(auVar45);
      auVar50._8_8_ = 0;
      auVar50._0_8_ = auVar24._0_8_;
      auVar24._8_8_ = 0;
      auVar24._0_8_ = auVar23._0_8_;
      auVar25 = vcvttpd2dq_avx512f(auVar40);
      auVar51 = vpmovdb_avx512vl(auVar26);
      auVar23 = vpmovdb_avx512vl(auVar25);
      auVar55._8_8_ = 0;
      auVar55._0_8_ = auVar51._0_8_;
      auVar53._8_8_ = 0;
      auVar53._0_8_ = auVar22._0_8_;
      auVar28._0_16_ = ZEXT116(0) * auVar55 + ZEXT116(1) * auVar53;
      auVar28._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar55;
      auVar38 = vinserti64x4_avx512f
                          (ZEXT3264(CONCAT1616(ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                                               ZEXT116(1) * auVar52,
                                               ZEXT116(0) * auVar52 + ZEXT116(1) * auVar49)),auVar28
                           ,1);
      auVar26 = vcvttpd2dq_avx512f(auVar41);
      auVar22 = vpmovdb_avx512vl(auVar26);
      auVar54._8_8_ = 0;
      auVar54._0_8_ = auVar22._0_8_;
      auVar51._8_8_ = 0;
      auVar51._0_8_ = auVar23._0_8_;
      auVar25._0_16_ = ZEXT116(0) * auVar54 + ZEXT116(1) * auVar51;
      auVar25._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar54;
      auVar39 = vinserti64x4_avx512f
                          (ZEXT3264(CONCAT1616(ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                                               ZEXT116(1) * auVar50,
                                               ZEXT116(0) * auVar50 + ZEXT116(1) * auVar24)),auVar25
                           ,1);
      auVar38 = vpunpcklqdq_avx512f(auVar38,auVar39);
      auVar38 = vmovdqu64_avx512f(auVar38);
      *(undefined1 (*) [64])(*pauVar13 + lVar14) = auVar38;
      lVar14 = lVar14 + 0x40;
    } while (lVar14 != 0x100);
    local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)pauVar13;
    local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    LookupTable(in,startXIn,startYIn,out,startXOut,startYOut,width,height,&local_48);
    operator_delete(pauVar13);
    return;
  }
  Copy(in,startXIn,startYIn,out,startXOut,startYOut,width,height);
  return;
}

Assistant:

void Normalize( const Image & in, uint32_t startXIn, uint32_t startYIn, Image & out, uint32_t startXOut, uint32_t startYOut,
                    uint32_t width, uint32_t height )
    {
        ParameterValidation( in, startXIn, startYIn, out, startXOut, startYOut, width, height );

        const uint8_t colorCount = CommonColorCount( in, out );
        const uint32_t rowSizeIn = in.rowSize();

        const uint8_t * inY    = in.data()  + startYIn  * rowSizeIn + startXIn * colorCount;
        const uint8_t * inYEnd = inY + height * rowSizeIn;

        uint8_t minimum = 255;
        uint8_t maximum = 0;

        const uint32_t realWidth = width * colorCount;

        for( ; inY != inYEnd; inY += rowSizeIn ) {
            const uint8_t * inX = inY;
            const uint8_t * inXEnd = inX + realWidth;

            for( ; inX != inXEnd; ++inX ) {
                if( minimum > (*inX) )
                    minimum = (*inX);

                if( maximum < (*inX) )
                    maximum = (*inX);
            }
        }

        if( (minimum == 0 && maximum == 255) || (minimum == maximum) ) {
            Copy( in, startXIn, startYIn, out, startXOut, startYOut, width, height );
        }
        else {
            const double correction = 255.0 / (maximum - minimum);

            // We precalculate all values and store them in lookup table
            std::vector < uint8_t > value( 256 );

            for( uint16_t i = 0; i < 256; ++i )
                value[i] = static_cast <uint8_t>((i - minimum) * correction + 0.5);

            LookupTable( in, startXIn, startYIn, out, startXOut, startYOut, width, height, value );
        }
    }